

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer_manager.cpp
# Opt level: O3

bool __thiscall duckdb::CSVBufferManager::ReadNextAndCacheIt(CSVBufferManager *this)

{
  shared_ptr<duckdb::CSVBuffer,_true> *this_00;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar2;
  ClientContext *pCVar3;
  bool bVar4;
  CSVBuffer *__tmp;
  CSVBuffer *pCVar5;
  CSVFileHandle *file_handle;
  type buffer_size;
  byte unaff_BPL;
  bool bVar6;
  shared_ptr<duckdb::CSVBuffer,_true> maybe_last_buffer;
  element_type *local_48;
  ClientContext *pCStack_40;
  
  this_00 = &this->last_buffer;
  bVar4 = true;
  do {
    bVar6 = bVar4;
    pCVar5 = shared_ptr<duckdb::CSVBuffer,_true>::operator->(this_00);
    bVar1 = pCVar5->last_buffer;
    if (bVar1 == false) {
      file_handle = (CSVFileHandle *)shared_ptr<duckdb::CSVBuffer,_true>::operator->(this_00);
      buffer_size = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>
                    ::operator*(&this->file_handle);
      CSVBuffer::Next((CSVBuffer *)&local_48,file_handle,(idx_t)buffer_size,
                      (bool *)this->buffer_size);
      pCVar3 = pCStack_40;
      peVar2 = local_48;
      unaff_BPL = local_48 != (element_type *)0x0;
      if (local_48 == (element_type *)0x0) {
        pCVar5 = shared_ptr<duckdb::CSVBuffer,_true>::operator->(this_00);
        pCVar5->last_buffer = true;
        if (pCStack_40 != (ClientContext *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCStack_40);
        }
      }
      else {
        local_48 = (element_type *)0x0;
        pCStack_40 = (ClientContext *)0x0;
        (this->last_buffer).internal.
        super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
        this_01 = (this->last_buffer).internal.
                  super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (this->last_buffer).internal.
        super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar3;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        pCVar5 = shared_ptr<duckdb::CSVBuffer,_true>::operator->(this_00);
        this->bytes_read = this->bytes_read + pCVar5->actual_buffer_size;
        ::std::
        vector<duckdb::shared_ptr<duckdb::CSVBuffer,true>,std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,true>>>
        ::emplace_back<duckdb::shared_ptr<duckdb::CSVBuffer,true>&>
                  ((vector<duckdb::shared_ptr<duckdb::CSVBuffer,true>,std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,true>>>
                    *)&this->cached_buffers,this_00);
      }
      break;
    }
    bVar4 = false;
  } while (bVar6);
  return (bool)((bVar1 ^ 1U) & unaff_BPL);
}

Assistant:

bool CSVBufferManager::ReadNextAndCacheIt() {
	D_ASSERT(last_buffer);
	for (idx_t i = 0; i < 2; i++) {
		if (!last_buffer->IsCSVFileLastBuffer()) {
			auto maybe_last_buffer = last_buffer->Next(*file_handle, buffer_size, has_seeked);
			if (!maybe_last_buffer) {
				last_buffer->last_buffer = true;
				return false;
			}
			last_buffer = std::move(maybe_last_buffer);
			bytes_read += last_buffer->GetBufferSize();
			cached_buffers.emplace_back(last_buffer);
			return true;
		}
	}
	return false;
}